

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

void duckdb_snappy::RawCompressFromIOVec
               (iovec *iov,size_t uncompressed_length,char *compressed,size_t *compressed_length,
               CompressionOptions options)

{
  UncheckedByteArraySink writer;
  SnappyIOVecReader reader;
  UncheckedByteArraySink local_58;
  SnappyIOVecReader local_48;
  
  SnappyIOVecReader::SnappyIOVecReader(&local_48,iov,uncompressed_length);
  local_58.super_Sink._vptr_Sink = (_func_int **)&PTR__UncheckedByteArraySink_027de818;
  local_58.dest_ = compressed;
  Compress(&local_48.super_Source,&local_58.super_Sink,options);
  *compressed_length = (long)local_58.dest_ - (long)compressed;
  UncheckedByteArraySink::~UncheckedByteArraySink(&local_58);
  ByteArraySource::~ByteArraySource((ByteArraySource *)&local_48);
  return;
}

Assistant:

void RawCompressFromIOVec(const struct iovec* iov, size_t uncompressed_length,
                          char* compressed, size_t* compressed_length,
                          CompressionOptions options) {
  SnappyIOVecReader reader(iov, uncompressed_length);
  UncheckedByteArraySink writer(compressed);
  Compress(&reader, &writer, options);

  // Compute how many bytes were added.
  *compressed_length = writer.CurrentDestination() - compressed;
}